

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.h
# Opt level: O3

void gnns::save_to_file<unsigned_int>(Matrix<unsigned_int> *m,string *file_name)

{
  FILE *__s;
  runtime_error *this;
  long *plVar1;
  long *plVar2;
  uint uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  __s = fopen((file_name->_M_dataplus)._M_p,"wb");
  if (__s != (FILE *)0x0) {
    if (m->rows != 0) {
      uVar3 = 0;
      do {
        fwrite(m,4,1,__s);
        fwrite(m->data + m->cols * uVar3,(ulong)m->cols << 2,1,__s);
        uVar3 = uVar3 + 1;
      } while (uVar3 < m->rows);
    }
    fclose(__s);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"File ","");
  std::operator+(&local_48,&local_88,file_name);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_48);
  local_68 = (long *)*plVar1;
  plVar2 = plVar1 + 2;
  if (local_68 == plVar2) {
    local_58 = *plVar2;
    lStack_50 = plVar1[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar2;
  }
  local_60 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::runtime_error::runtime_error(this,(string *)&local_68);
  *(undefined ***)this = &PTR__runtime_error_00107d60;
  __cxa_throw(this,&GnnsException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void save_to_file(const Matrix<T>& m, const std::string& file_name)
    {
        FILE *fp = fopen(file_name.c_str(), "wb");

        if(fp == NULL)
        {
            throw GnnsException(std::string("File ") + file_name + "is NOT exist!\n");
        }

        for(int i=0;i<m.rows;++i)
        {
            //write the dim
            fwrite(&m.cols, 4, 1, fp);
            //write the row data
            fwrite(m[i], sizeof(T)*m.cols, 1, fp);
        }

        fclose(fp);
    }